

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

bool __thiscall QAbstractItemView::focusNextPrevChild(QAbstractItemView *this,bool next)

{
  char cVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QKeyEvent event;
  QArrayData *local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined1 *local_88;
  undefined8 uStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (((*(char *)(*(long *)(this + 8) + 0x3c8) == '\x01') &&
      ((*(uint *)(*(long *)(this + 0x20) + 8) & 0x8001) == 0x8000)) &&
     ((*(byte *)(*(long *)(*(long *)(*(long *)(this + 8) + 0x2b0) + 0x20) + 8) & 1) == 0)) {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    uStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_a8 = (QArrayData *)0x0;
    uStack_a0 = 0;
    local_98 = 0;
    QKeyEvent::QKeyEvent((QKeyEvent *)&local_88,6,0x1000002 - (uint)next,0,&local_a8,0,1);
    if (local_a8 != (QArrayData *)0x0) {
      LOCK();
      (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_a8,2,0x10);
      }
    }
    (**(code **)(*(long *)this + 0xc0))(this,(QKeyEvent *)&local_88);
    cVar1 = uStack_80._4_1_;
    QKeyEvent::~QKeyEvent((QKeyEvent *)&local_88);
    bVar2 = true;
    if (cVar1 != '\0') goto LAB_00531bc6;
  }
  bVar2 = QWidget::focusNextPrevChild((QWidget *)this,next);
LAB_00531bc6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QAbstractItemView::focusNextPrevChild(bool next)
{
    Q_D(QAbstractItemView);
    if (d->tabKeyNavigation && isVisible() && isEnabled() && d->viewport->isEnabled()) {
        QKeyEvent event(QEvent::KeyPress, next ? Qt::Key_Tab : Qt::Key_Backtab, Qt::NoModifier);
        keyPressEvent(&event);
        if (event.isAccepted())
            return true;
    }
    return QAbstractScrollArea::focusNextPrevChild(next);
}